

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

bool __thiscall Database::empty(Database *this)

{
  bool bVar1;
  iterator local_50;
  iterator local_30;
  
  begin(&local_50,this);
  end(&local_30,this);
  if (local_30.files_it.current._M_current == local_30.files_end.current._M_current) {
    bVar1 = local_50.files_it.current._M_current == local_50.files_end.current._M_current;
  }
  else {
    bVar1 = false;
    if ((local_50.files_it.current._M_current == local_30.files_it.current._M_current) &&
       (bVar1 = false,
       local_50.files_end.current._M_current == local_30.files_end.current._M_current)) {
      if (local_50.lines_it.current._M_current == local_30.lines_it.current._M_current) {
        bVar1 = local_50.lines_end.current._M_current == local_30.lines_end.current._M_current;
      }
      else {
        bVar1 = false;
      }
    }
  }
  return bVar1;
}

Assistant:

bool Database::empty ()
{
  return Database::begin () == Database::end ();
}